

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_opaque_pass.cpp
# Opt level: O0

Status __thiscall
spvtools::opt::InlineOpaquePass::InlineOpaque(InlineOpaquePass *this,Function *func)

{
  bool bVar1;
  Instruction *pIVar2;
  size_type sVar3;
  undefined1 local_f0 [16];
  iterator local_e0;
  undefined1 local_d0 [24];
  type local_b8;
  int local_a4;
  pointer local_a0;
  IRContext *local_98;
  iterator local_90;
  undefined1 local_88 [8];
  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
  newVars;
  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
  newBlocks;
  undefined1 local_50 [8];
  iterator ii;
  undefined1 local_38 [8];
  iterator bi;
  bool modified;
  Function *func_local;
  InlineOpaquePass *this_local;
  
  bi.iterator_._M_current._7_1_ = 0;
  _local_38 = Function::begin(func);
  do {
    _ii = Function::end(func);
    bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                      ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38,
                       (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&ii);
    if (!bVar1) {
      this_local._4_4_ = SuccessWithoutChange;
      if ((bi.iterator_._M_current._7_1_ & 1) != 0) {
        this_local._4_4_ = SuccessWithChange;
      }
      return this_local._4_4_;
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
    BasicBlock::begin((BasicBlock *)local_50);
    while( true ) {
      UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
      BasicBlock::end((BasicBlock *)
                      &newBlocks.
                       super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
      bVar1 = utils::operator!=((iterator_template<spvtools::opt::Instruction> *)local_50,
                                (iterator_template<spvtools::opt::Instruction> *)
                                &newBlocks.
                                 super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (!bVar1) break;
      pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
               iterator_template<spvtools::opt::Instruction>::operator*
                         ((iterator_template<spvtools::opt::Instruction> *)local_50);
      bVar1 = InlinePass::IsInlinableFunctionCall(&this->super_InlinePass,pIVar2);
      if (bVar1) {
        pIVar2 = utils::IntrusiveList<spvtools::opt::Instruction>::
                 iterator_template<spvtools::opt::Instruction>::operator*
                           ((iterator_template<spvtools::opt::Instruction> *)local_50);
        bVar1 = HasOpaqueArgsOrReturn(this,pIVar2);
        if (!bVar1) goto LAB_0039d984;
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ::vector((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                  *)&newVars.
                     super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::
        vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ::vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  *)local_88);
        InstructionList::iterator::iterator(&local_90,(iterator *)local_50);
        local_a0 = (pointer)local_38;
        local_98 = (IRContext *)bi.container_;
        bVar1 = InlinePass::GenInlineCode
                          (&this->super_InlinePass,
                           (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                            *)&newVars.
                               super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                            *)local_88,&local_90,_local_38);
        if (bVar1) {
          sVar3 = std::
                  vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                  ::size((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                          *)&newVars.
                             super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_end_of_storage);
          if (1 < sVar3) {
            InlinePass::UpdateSucceedingPhis
                      (&this->super_InlinePass,
                       (vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                        *)&newVars.
                           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          }
          local_b8 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::Erase<false>
                               ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
          local_38 = (undefined1  [8])local_b8.container_;
          bi.container_ = (UptrVector *)local_b8.iterator_._M_current;
          local_d0._8_16_ =
               (undefined1  [16])
               UptrVectorIterator<spvtools::opt::BasicBlock,_false>::InsertBefore<false>
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38,
                          (UptrVector *)
                          &newVars.
                           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
          _local_38 = (type)local_d0._8_16_;
          sVar3 = std::
                  vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                  ::size((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                          *)local_88);
          if (sVar3 != 0) {
            local_e0 = Function::begin(func);
            UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->(&local_e0);
            BasicBlock::begin((BasicBlock *)local_d0);
            InstructionList::iterator::InsertBefore
                      ((iterator *)(local_f0 + 8),
                       (vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                        *)local_d0);
          }
          UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator->
                    ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
          BasicBlock::begin((BasicBlock *)local_f0);
          InstructionList::iterator::operator=((iterator *)local_50,(iterator *)local_f0);
          bi.iterator_._M_current._7_1_ = 1;
          local_a4 = 0;
        }
        else {
          this_local._4_4_ = Failure;
          local_a4 = 1;
        }
        std::
        vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ::~vector((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                   *)local_88);
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
        ::~vector((vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
                   *)&newVars.
                      super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
        if (local_a4 != 0) {
          return this_local._4_4_;
        }
      }
      else {
LAB_0039d984:
        InstructionList::iterator::operator++((iterator *)local_50);
      }
    }
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)local_38);
  } while( true );
}

Assistant:

Pass::Status InlineOpaquePass::InlineOpaque(Function* func) {
  bool modified = false;
  // Using block iterators here because of block erasures and insertions.
  for (auto bi = func->begin(); bi != func->end(); ++bi) {
    for (auto ii = bi->begin(); ii != bi->end();) {
      if (IsInlinableFunctionCall(&*ii) && HasOpaqueArgsOrReturn(&*ii)) {
        // Inline call.
        std::vector<std::unique_ptr<BasicBlock>> newBlocks;
        std::vector<std::unique_ptr<Instruction>> newVars;
        if (!GenInlineCode(&newBlocks, &newVars, ii, bi)) {
          return Status::Failure;
        }

        // If call block is replaced with more than one block, point
        // succeeding phis at new last block.
        if (newBlocks.size() > 1) UpdateSucceedingPhis(newBlocks);
        // Replace old calling block with new block(s).
        bi = bi.Erase();
        bi = bi.InsertBefore(&newBlocks);
        // Insert new function variables.
        if (newVars.size() > 0)
          func->begin()->begin().InsertBefore(std::move(newVars));
        // Restart inlining at beginning of calling block.
        ii = bi->begin();
        modified = true;
      } else {
        ++ii;
      }
    }
  }
  return (modified ? Status::SuccessWithChange : Status::SuccessWithoutChange);
}